

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

uint8_t * __thiscall Lodtalk::VMHeap::allocate(VMHeap *this,size_t objectSize)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  size_t newCapacity;
  uint8_t *result;
  size_t newHeapSize;
  size_t objectSize_local;
  VMHeap *this_local;
  
  uVar2 = this->size + objectSize;
  this_local = (VMHeap *)(this->addressSpace + this->size);
  if (this->capacity < uVar2) {
    uVar3 = (uVar2 + this->pageSize) - 1 & (this->pageSize - 1 ^ 0xffffffffffffffff);
    bVar1 = allocateVirtualAddressRegion(this->addressSpace,this->capacity,uVar3 - this->capacity);
    if (bVar1) {
      this->size = uVar2;
      this->capacity = uVar3;
    }
    else {
      this_local = (VMHeap *)0x0;
    }
  }
  else {
    this->size = uVar2;
  }
  return (uint8_t *)this_local;
}

Assistant:

uint8_t *VMHeap::allocate(size_t objectSize)
{
    size_t newHeapSize = size + objectSize;
    auto result = addressSpace + size;

    // Check the current capacity
    if(newHeapSize <= capacity)
    {
        size = newHeapSize;
        return result;
    }

    // Compute the new capacity
    auto newCapacity = (newHeapSize + pageSize - 1) & (~ (pageSize - 1));
    if(!allocateVirtualAddressRegion(addressSpace, capacity, newCapacity - capacity))
        return nullptr;

    // Store the new capacity and sizes
    //printf("vm heap %zu %zu\n", newHeapSize, newCapacity);
    size = newHeapSize;
    capacity = newCapacity;
    return result;
}